

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O1

cs_err X86_option(cs_struct *handle,cs_opt_type type,size_t value)

{
  cs_err cVar1;
  uint8_t *puVar2;
  
  cVar1 = CS_ERR_OK;
  if (type == CS_OPT_SYNTAX) {
    if (value < 2) {
      handle->syntax = 1;
      handle->printer = X86_Intel_printInst;
      return cVar1;
    }
    if (value != 2) {
      if (value == 4) {
        handle->printer = X86_Intel_printInst;
        handle->syntax = 4;
        return cVar1;
      }
      handle->errnum = CS_ERR_OPTION;
      return CS_ERR_OPTION;
    }
    handle->printer = X86_ATT_printInst;
    handle->syntax = 2;
  }
  else if (type == CS_OPT_MODE) {
    if (value == 8) {
      puVar2 = "";
    }
    else {
      puVar2 = "";
    }
    handle->regsize_map = puVar2;
    handle->mode = (cs_mode)value;
    return cVar1;
  }
  return cVar1;
}

Assistant:

cs_err X86_option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		default:
			break;
		case CS_OPT_MODE:
			if (value == CS_MODE_64)
				handle->regsize_map = regsize_map_64;
			else
				handle->regsize_map = regsize_map_32;

			handle->mode = (cs_mode)value;
			break;
		case CS_OPT_SYNTAX:
			switch(value) {
				default:
					// wrong syntax value
					handle->errnum = CS_ERR_OPTION;
					return CS_ERR_OPTION;

				case CS_OPT_SYNTAX_DEFAULT:
				case CS_OPT_SYNTAX_INTEL:
					handle->syntax = CS_OPT_SYNTAX_INTEL;
					handle->printer = X86_Intel_printInst;
					break;

				case CS_OPT_SYNTAX_MASM:
					handle->printer = X86_Intel_printInst;
					handle->syntax = (int)value;
					break;

				case CS_OPT_SYNTAX_ATT:
#if !defined(CAPSTONE_DIET) && !defined(CAPSTONE_X86_ATT_DISABLE)
					handle->printer = X86_ATT_printInst;
					handle->syntax = CS_OPT_SYNTAX_ATT;
					break;
#elif !defined(CAPSTONE_DIET) && defined(CAPSTONE_X86_ATT_DISABLE)
					// ATT syntax is unsupported
					handle->errnum = CS_ERR_X86_ATT;
					return CS_ERR_X86_ATT;
#else	// CAPSTONE_DIET
					// this is irrelevant in CAPSTONE_DIET mode
					handle->errnum = CS_ERR_DIET;
					return CS_ERR_DIET;
#endif
			}
			break;
	}

	return CS_ERR_OK;
}